

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_buffer.cc
# Opt level: O2

bool __thiscall draco::DataBuffer::Update(DataBuffer *this,void *data,int64_t size,int64_t offset)

{
  int64_t *piVar1;
  
  if (data == (void *)0x0) {
    if (offset + size < 0) {
      return false;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->data_,offset + size);
  }
  else {
    if (size < 0) {
      return false;
    }
    if ((long)(this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start < offset + size) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->data_,offset + size)
      ;
    }
    if (size != 0) {
      memmove((this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start + offset,data,size);
    }
  }
  piVar1 = &(this->descriptor_).buffer_update_count;
  *piVar1 = *piVar1 + 1;
  return true;
}

Assistant:

bool DataBuffer::Update(const void *data, int64_t size, int64_t offset) {
  if (data == nullptr) {
    if (size + offset < 0) {
      return false;
    }
    // If no data is provided, just resize the buffer.
    data_.resize(size + offset);
  } else {
    if (size < 0) {
      return false;
    }
    if (size + offset > static_cast<int64_t>(data_.size())) {
      data_.resize(size + offset);
    }
    const uint8_t *const byte_data = static_cast<const uint8_t *>(data);
    std::copy(byte_data, byte_data + size, data_.data() + offset);
  }
  descriptor_.buffer_update_count++;
  return true;
}